

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::QPDFWriter(QPDFWriter *this,QPDF *pdf,char *description,FILE *file,bool close_file)

{
  Members *this_00;
  bool close_file_local;
  FILE *file_local;
  char *description_local;
  QPDF *pdf_local;
  QPDFWriter *this_local;
  
  this_00 = (Members *)operator_new(0x430);
  Members::Members(this_00,pdf);
  std::shared_ptr<QPDFWriter::Members>::shared_ptr<QPDFWriter::Members,void>(&this->m,this_00);
  setOutputFile(this,description,file,close_file);
  return;
}

Assistant:

QPDFWriter::QPDFWriter(QPDF& pdf, char const* description, FILE* file, bool close_file) :
    m(new Members(pdf))
{
    setOutputFile(description, file, close_file);
}